

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

uint32_t __thiscall HvFile::allocpath(HvFile *this,HKEY root,uint32_t parent,string *path)

{
  uint32_t id_00;
  uint32_t uVar1;
  key *pkVar2;
  size_type sVar3;
  __shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  roots *prVar6;
  uint32_t rkey;
  uint32_t lkey;
  uint32_t id;
  shared_ptr<ent::base> local_30;
  string *local_20;
  string *path_local;
  uint32_t parent_local;
  HKEY root_local;
  HvFile *this_local;
  
  local_20 = path;
  path_local._0_4_ = parent;
  path_local._4_4_ = root;
  _parent_local = this;
  pkVar2 = (key *)operator_new(0x80);
  sVar3 = std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>::
          size(&this->_items);
  ent::key::key(pkVar2,(uint32_t)sVar3,local_20);
  std::shared_ptr<ent::base>::shared_ptr<ent::key,void>(&local_30,pkVar2);
  std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>::push_back
            (&this->_items,&local_30);
  std::shared_ptr<ent::base>::~shared_ptr(&local_30);
  p_Var4 = (__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>::
           back(&this->_items);
  peVar5 = std::__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var4);
  id_00 = ent::base::id(peVar5);
  if ((uint32_t)path_local == 0) {
    p_Var4 = (__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>::
             operator[](&this->_items,(ulong)this->_rootid);
    peVar5 = std::__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var4);
    prVar6 = ent::base::asroots(peVar5);
    uVar1 = ent::roots::lasthivekey(prVar6,path_local._4_4_);
    if (uVar1 == 0) {
      p_Var4 = (__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
               ::operator[](&this->_items,(ulong)this->_rootid);
      peVar5 = std::__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      prVar6 = ent::base::asroots(peVar5);
      ent::roots::hiveid(prVar6,path_local._4_4_,id_00);
    }
    else {
      p_Var4 = (__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
               ::operator[](&this->_items,(ulong)uVar1);
      peVar5 = std::__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      pkVar2 = ent::base::askey(peVar5);
      ent::key::nextsibling(pkVar2,id_00);
    }
    p_Var4 = (__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>::
             operator[](&this->_items,(ulong)this->_rootid);
    peVar5 = std::__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var4);
    prVar6 = ent::base::asroots(peVar5);
    ent::roots::lasthivekey(prVar6,path_local._4_4_,id_00);
  }
  else {
    p_Var4 = (__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>::
             operator[](&this->_items,(ulong)(uint32_t)path_local);
    peVar5 = std::__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var4);
    pkVar2 = ent::base::askey(peVar5);
    uVar1 = ent::key::lastchild(pkVar2);
    if (uVar1 == 0) {
      p_Var4 = (__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
               ::operator[](&this->_items,(ulong)(uint32_t)path_local);
      peVar5 = std::__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      pkVar2 = ent::base::askey(peVar5);
      ent::key::firstchild(pkVar2,id_00);
    }
    else {
      p_Var4 = (__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
               ::operator[](&this->_items,(ulong)uVar1);
      peVar5 = std::__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      pkVar2 = ent::base::askey(peVar5);
      ent::key::nextsibling(pkVar2,id_00);
    }
    p_Var4 = (__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>::
             operator[](&this->_items,(ulong)(uint32_t)path_local);
    peVar5 = std::__shared_ptr_access<ent::base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var4);
    pkVar2 = ent::base::askey(peVar5);
    ent::key::lastchild(pkVar2,id_00);
  }
  return id_00;
}

Assistant:

uint32_t allocpath(HKEY root, uint32_t parent, const std::string& path)
    {
        _items.push_back(ent::entry_ptr(new ent::key(_items.size(), path)));
        uint32_t id= _items.back()->id();

        if (parent) {
            uint32_t lkey= _items[parent]->askey()->lastchild();
            if (!lkey)
                _items[parent]->askey()->firstchild(id);
            else
                _items[lkey]->askey()->nextsibling(id);
            _items[parent]->askey()->lastchild(id);
        }
        else {
            uint32_t rkey= _items[_rootid]->asroots()->lasthivekey(root);
            if (!rkey)
                _items[_rootid]->asroots()->hiveid(root, id);
            else 
                _items[rkey]->askey()->nextsibling(id);
            _items[_rootid]->asroots()->lasthivekey(root, id);
        }

        return id;
    }